

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
llvm::cl::HideUnrelatedOptions
          (cl *this,ArrayRef<const_llvm::cl::OptionCategory_*> Categories,SubCommand *Sub)

{
  long *plVar1;
  long lVar2;
  cl *pcVar3;
  ulong uVar4;
  long *plVar5;
  
  plVar1 = *(long **)(Categories.Length + 0x80);
  uVar4 = (ulong)*(uint *)(Categories.Length + 0x88);
  plVar5 = plVar1;
  if (uVar4 != 0) {
    for (; (*plVar5 == 0 || (*plVar5 == -8)); plVar5 = plVar5 + 1) {
    }
  }
  if (plVar5 != plVar1 + uVar4) {
    do {
      lVar2 = *plVar5;
      pcVar3 = (cl *)std::
                     __find_if<llvm::cl::OptionCategory_const*const*,__gnu_cxx::__ops::_Iter_equals_val<llvm::cl::OptionCategory*const>>
                               (this,this + (long)Categories.Data * 8,*(long *)(lVar2 + 8) + 0x48);
      if ((pcVar3 == this + (long)Categories.Data * 8) &&
         (lVar2 = *(long *)(lVar2 + 8), *(OptionCategory **)(lVar2 + 0x48) != &GenericCategory)) {
        *(ushort *)(lVar2 + 0xc) = (ushort)*(undefined4 *)(lVar2 + 0xc) & 0xff9f | 0x40;
      }
      do {
        do {
          plVar5 = plVar5 + 1;
        } while (*plVar5 == 0);
      } while (*plVar5 == -8);
    } while (plVar5 != plVar1 + uVar4);
  }
  return;
}

Assistant:

void cl::HideUnrelatedOptions(ArrayRef<const cl::OptionCategory *> Categories,
                              SubCommand &Sub) {
  auto CategoriesBegin = Categories.begin();
  auto CategoriesEnd = Categories.end();
  for (auto &I : Sub.OptionsMap) {
    if (std::find(CategoriesBegin, CategoriesEnd, I.second->Category) ==
            CategoriesEnd &&
        I.second->Category != &GenericCategory)
      I.second->setHiddenFlag(cl::ReallyHidden);
  }
}